

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_result.cc
# Opt level: O1

result<Foo,_ErrorMsg> * __thiscall
Foo::create_abi_cxx11_(result<Foo,_ErrorMsg> *__return_storage_ptr__,Foo *this,int n)

{
  undefined8 *puVar1;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  if ((int)this < 0x15) {
    *(int *)&(__return_storage_ptr__->
             super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> = (int)this;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->
             super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> + 0x20) = '\0';
  }
  else {
    local_38 = &local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Too big!","");
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ).
                     super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._value.
                     super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
                     super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
                     super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->
      super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ).
      super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._value.
      super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> = puVar1;
    if (local_38 == &local_28) {
      *puVar1 = CONCAT71(uStack_27,local_28);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> + 0x18) = uStack_20;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->
        super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ).
        super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._value.
        super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> = local_38;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ).
                        super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._value.
                        super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
                        super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
                        super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> + 0x10) =
           CONCAT71(uStack_27,local_28);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> + 8) = local_30;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->
             super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

static ezy::result<Foo, ErrorMsg> create(int n)
    {
      if (n > 20)
      {
        return ErrorMsg{"Too big!"};
      }

      return Foo(n);
    }